

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemidx(BinaryReader *this,Index *memidx,char *desc)

{
  Result RVar1;
  undefined8 in_RAX;
  ulong uVar2;
  uint32_t value;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  RVar1 = ReadU32Leb128(this,&local_14,desc);
  if (RVar1.enum_ != Error) {
    *memidx = local_14;
    uVar2 = ((long)(this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    if (local_14 <= uVar2 && uVar2 - local_14 != 0) {
      return (Result)Ok;
    }
    PrintError(this,"memory index %u out of range");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadMemidx(Index* memidx, const char* desc) {
  CHECK_RESULT(ReadIndex(memidx, desc));
  ERROR_UNLESS(*memidx < memories.size(), "memory index %u out of range",
               *memidx);
  return Result::Ok;
}